

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

void * mi_os_prim_alloc(size_t size,size_t try_alignment,_Bool commit,_Bool allow_large,
                       _Bool *is_large,_Bool *is_zero)

{
  uint uVar1;
  size_t try_alignment_00;
  void *p;
  
  if (size != 0) {
    try_alignment_00 = try_alignment + (try_alignment == 0);
    *is_zero = false;
    p = (void *)0x0;
    uVar1 = _mi_prim_alloc((void *)0x0,size,try_alignment_00,commit,allow_large && commit,is_large,
                           is_zero,&p);
    if (uVar1 != 0) {
      _mi_warning_message("unable to allocate OS memory (error: %d (0x%x), addr: %p, size: 0x%zx bytes, align: 0x%zx, commit: %d, allow large: %d)\n"
                          ,(ulong)uVar1,(ulong)uVar1,0,size,try_alignment_00,(ulong)commit,
                          (ulong)(allow_large && commit));
    }
    _mi_stat_counter_increase(&_mi_stats_main.mmap_calls,1);
    if (p != (void *)0x0) {
      _mi_stat_increase(&_mi_stats_main.reserved,size);
      if (commit) {
        _mi_stat_increase(&_mi_stats_main.committed,size);
      }
    }
    return p;
  }
  return (void *)0x0;
}

Assistant:

static void* mi_os_prim_alloc_at(void* hint_addr, size_t size, size_t try_alignment, bool commit, bool allow_large, bool* is_large, bool* is_zero) {
  mi_assert_internal(size > 0 && (size % _mi_os_page_size()) == 0);
  mi_assert_internal(is_zero != NULL);
  mi_assert_internal(is_large != NULL);
  if (size == 0) return NULL;
  if (!commit) { allow_large = false; }
  if (try_alignment == 0) { try_alignment = 1; } // avoid 0 to ensure there will be no divide by zero when aligning
  *is_zero = false;
  void* p = NULL;
  int err = _mi_prim_alloc(hint_addr, size, try_alignment, commit, allow_large, is_large, is_zero, &p);
  if (err != 0) {
    _mi_warning_message("unable to allocate OS memory (error: %d (0x%x), addr: %p, size: 0x%zx bytes, align: 0x%zx, commit: %d, allow large: %d)\n", err, err, hint_addr, size, try_alignment, commit, allow_large);
  }



  mi_os_stat_counter_increase(mmap_calls, 1);
  if (p != NULL) {
    mi_os_stat_increase(reserved, size);
    if (commit) {
      mi_os_stat_increase(committed, size);
      // seems needed for asan (or `mimalloc-test-api` fails)
      #ifdef MI_TRACK_ASAN
      if (*is_zero) { mi_track_mem_defined(p,size); }
               else { mi_track_mem_undefined(p,size); }
      #endif
    }
  }
  return p;
}